

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_reduce.hpp
# Opt level: O0

BBox<1> Omega_h::
        transform_reduce<Omega_h::IntIterator,Omega_h::GetBBoxOp<1>,Omega_h::BBox<1>,Omega_h::UniteOp<1>>
                  (Few<double,_1> param_1,Few<double,_1> param_2,int first,int last,
                  GetBBoxOp<1> *param_5)

{
  int iVar1;
  BBox<1> BVar2;
  double local_270;
  double local_268;
  undefined1 local_210 [8];
  type transform_local;
  GetBBoxOp<1> *transform_local_1;
  Few<double,_1> FStack_1f0;
  BBox<1> init_local;
  IntIterator last_local;
  IntIterator first_local;
  int local_124;
  Int i;
  double local_118;
  Few<double,_1> local_110 [2];
  double local_100 [1];
  BBox<1> c;
  int local_70;
  Int j;
  Vector<1> v;
  
  entering_parallel = 1;
  transform_local.coords.write_.shared_alloc_.direct_ptr = param_5;
  GetBBoxOp<1>::GetBBoxOp((GetBBoxOp<1> *)local_210,param_5);
  entering_parallel = 0;
  FStack_1f0.array_[0] = param_1.array_[0];
  init_local.min.super_Few<double,_1>.array_[0] = (Few<double,_1>)(Few<double,_1>)param_2.array_[0];
  for (init_local.max.super_Few<double,_1>.array_[0]._4_4_ = first;
      init_local.max.super_Few<double,_1>.array_[0]._4_4_ != last;
      init_local.max.super_Few<double,_1>.array_[0]._4_4_ =
           init_local.max.super_Few<double,_1>.array_[0]._4_4_ + 1) {
    for (local_70 = 0; local_70 < 1; local_70 = local_70 + 1) {
      iVar1 = local_70;
      (&v)[(long)local_70 + -1].super_Few<double,_1>.array_[0] =
           (double)(&(transform_local.coords.write_.shared_alloc_.alloc)->size)
                   [init_local.max.super_Few<double,_1>.array_[0]._4_4_ + local_70];
      v.super_Few<double,_1>.array_[0]._4_4_ = iVar1;
    }
    local_110[0].array_[0] = FStack_1f0.array_[0];
    local_110[1].array_[0] = (double  [1])(double  [1])init_local.min.super_Few<double,_1>.array_[0]
    ;
    for (local_124 = 0; local_124 < 1; local_124 = local_124 + 1) {
      local_268 = local_110[local_124].array_[0];
      if (*(double *)(&stack0xfffffffffffffee0 + (long)local_124 * 8) < local_268) {
        local_268 = *(double *)(&stack0xfffffffffffffee0 + (long)local_124 * 8);
      }
      (&(&c)[-1].max)[local_124].super_Few<double,_1>.array_[0] = local_268;
      local_270 = local_110[(long)local_124 + 1].array_[0];
      if (local_270 < (&local_118)[local_124]) {
        local_270 = (&local_118)[local_124];
      }
      iVar1 = local_124;
      (&c.min)[local_124].super_Few<double,_1>.array_[0] = local_270;
      c.max.super_Few<double,_1>.array_[0]._4_4_ = iVar1;
    }
    FStack_1f0.array_[0] = (double  [1])(double  [1])local_100[0];
    init_local.min = c.min;
  }
  GetBBoxOp<1>::~GetBBoxOp((GetBBoxOp<1> *)local_210);
  BVar2.max = (Vector<1>)(Vector<1>)init_local.min.super_Few<double,_1>.array_[0];
  BVar2.min.super_Few<double,_1>.array_[0] = (Few<double,_1>)(Few<double,_1>)FStack_1f0.array_[0];
  return BVar2;
}

Assistant:

Result transform_reduce(
    Iterator first, Iterator last, Result init, Op op, Tranform&& transform) {
  Omega_h::entering_parallel = true;
  auto const transform_local = std::move(transform);
  Omega_h::entering_parallel = false;
  for (; first != last; ++first) {
    init = op(std::move(init), transform_local(*first));
  }
  return init;
}